

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_addrelocs(GlobalVars *gv,_func_uint8_t_Reloc_ptr *reloc_vlink2elf)

{
  char *pcVar1;
  uint uVar2;
  uint32_t type;
  size_t sVar3;
  char *__s;
  LinkedSection *in_RSI;
  GlobalVars *in_RDI;
  char *relname;
  uint32_t roffs;
  uint32_t sroffs;
  Reloc *rel;
  LinkedSection *ls;
  bool be;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb4;
  uint32_t in_stack_ffffffffffffffc0;
  uint32_t info;
  uint32_t align;
  uint32_t uVar4;
  RelocList *pRVar5;
  node *pnVar6;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = (uint)(elf_endianess == '\x01');
  align = 0;
  for (pnVar6 = (in_RDI->lnksec).first; pnVar6->next != (node *)0x0; pnVar6 = pnVar6->next) {
    uVar4 = align;
    for (pRVar5 = (RelocList *)pnVar6[8].pred; (pRVar5->l).first != (node *)0x0;
        pRVar5 = (RelocList *)(pRVar5->l).first) {
      sVar3 = elf_addrela(in_RDI,in_RSI,(Reloc *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                          (bool)((ulong)pnVar6 >> 0x20),pRVar5,
                          (_func_uint8_t_Reloc_ptr *)CONCAT44(uVar4,align));
      align = align + (int)sVar3;
    }
    for (pRVar5 = (RelocList *)pnVar6[10].next; (pRVar5->l).first != (node *)0x0;
        pRVar5 = (RelocList *)(pRVar5->l).first) {
      sVar3 = elf_addrela(in_RDI,in_RSI,(Reloc *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                          (bool)((ulong)pnVar6 >> 0x20),pRVar5,
                          (_func_uint8_t_Reloc_ptr *)CONCAT44(uVar4,align));
      align = align + (int)sVar3;
    }
    if (align != uVar4) {
      strlen((char *)pnVar6[1].pred);
      uVar4 = (uint32_t)pRVar5;
      __s = (char *)alloc(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      pcVar1 = ".rel";
      if (in_RDI->reloctab_format == '\x02') {
        pcVar1 = ".rela";
      }
      sprintf(__s,".%s%s",pcVar1 + 1,pnVar6[1].pred);
      info = (uint32_t)__s;
      elf_addshdrstr((char *)0x12c1ea);
      in_stack_ffffffffffffffa0 = *(uint32_t *)&pnVar6[1].next;
      type = 8;
      if (in_RDI->reloctab_format == '\x02') {
        type = 0xc;
      }
      elf32_addshdr(in_stack_ffffffffffffffb4,type,in_stack_ffffffffffffffac,4,
                    in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffc0,
                    info,align,uVar4,(bool)pnVar6);
    }
  }
  return;
}

Assistant:

static void elf32_addrelocs(struct GlobalVars *gv,
                            uint8_t (*reloc_vlink2elf)(struct Reloc *))
/* creates relocations for all sections */
{
  bool be = elf_endianess == _BIG_ENDIAN_;
  struct LinkedSection *ls;
  struct Reloc *rel;
  uint32_t sroffs=0,roffs=0;

  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    sroffs = roffs;

    /* relocations */
    for (rel=(struct Reloc *)ls->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next)
      roffs += elf_addrela(gv,ls,rel,be,reloclist,reloc_vlink2elf);

    /* external references */
    for (rel=(struct Reloc *)ls->xrefs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next)
      roffs += elf_addrela(gv,ls,rel,be,reloclist,reloc_vlink2elf);

    if (roffs != sroffs) {
      /* create ".rel(a).name" header */
      char *relname = (char *)alloc(strlen(ls->name)+6);

      sprintf(relname,".%s%s",
              gv->reloctab_format==RTAB_ADDEND ? "rela" : "rel",
              ls->name);
      elf32_addshdr(elf_addshdrstr(relname),
                    gv->reloctab_format==RTAB_ADDEND ? SHT_RELA : SHT_REL,
                    0,0,sroffs,roffs-sroffs,0,(uint32_t)ls->index,4,
                    gv->reloctab_format==RTAB_ADDEND ?
                      sizeof(struct Elf32_Rela) : sizeof(struct Elf32_Rel),
                    be);
      /* sroffs is relative and will be corrected later */
      /* sh_link will be initialized, when .symtab exists */
    }
  }
}